

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O2

int SSE16x16_C(uint8_t *a,uint8_t *b)

{
  int iVar1;
  
  iVar1 = GetSSE(a,b,0x10,0x10);
  return iVar1;
}

Assistant:

static int SSE16x16_C(const uint8_t* WEBP_RESTRICT a,
                      const uint8_t* WEBP_RESTRICT b) {
  return GetSSE(a, b, 16, 16);
}